

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,REF_INT edge_geom)

{
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar4;
  REF_DBL *pRVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  REF_GEOM ref_geom;
  REF_INT RVar13;
  REF_ADJ pRVar14;
  long lVar15;
  REF_STATUS RVar16;
  bool bVar17;
  double uv [2];
  REF_INT nodes [27];
  int local_d4;
  REF_DBL local_d0;
  REF_GEOM local_c8;
  REF_ADJ local_c0;
  REF_DBL local_b8;
  REF_DBL local_b0;
  REF_DBL local_a8;
  undefined4 local_a0;
  int iStack_9c;
  
  RVar16 = 3;
  if ((-1 < edge_geom) && (ref_geom = ref_grid->geom, edge_geom < ref_geom->max)) {
    pRVar3 = ref_geom->descr;
    uVar7 = edge_geom * 6;
    if (pRVar3[uVar7] == 1) {
      pRVar14 = ref_geom->ref_adj;
      iVar1 = pRVar3[(ulong)uVar7 + 5];
      lVar15 = (long)iVar1;
      iVar12 = -1;
      uVar11 = 0xffffffff;
      if ((-1 < lVar15) && (uVar11 = 0xffffffff, iVar1 < pRVar14->nnode)) {
        uVar11 = (ulong)(uint)pRVar14->first[lVar15];
      }
      iVar10 = (int)uVar11;
      if (iVar10 != -1) {
        iVar12 = pRVar14->item[iVar10].ref;
      }
      local_d0 = ref_geom->param[(uint)(edge_geom * 2)];
      local_c8 = ref_geom;
      local_c0 = pRVar14;
      if (iVar10 != -1) {
        ref_cell = ref_grid->cell[3];
        bVar17 = false;
        do {
          if ((pRVar3[iVar12 * 6] == 2) && (bVar6 = !bVar17, bVar17 = true, bVar6)) {
            bVar17 = pRVar3[(long)(iVar12 * 6) + 3] != 0;
          }
          iVar10 = pRVar14->item[(int)uVar11].next;
          uVar11 = (ulong)iVar10;
          if (uVar11 == 0xffffffffffffffff) {
            iVar12 = -1;
          }
          else {
            iVar12 = pRVar14->item[uVar11].ref;
          }
        } while (iVar10 != -1);
        if (bVar17) {
          uVar11 = 0xffffffff;
          if (-1 < iVar1) {
            uVar11 = 0xffffffff;
            if (iVar1 < ref_cell->ref_adj->nnode) {
              uVar11 = (ulong)(uint)ref_cell->ref_adj->first[lVar15];
            }
          }
          if ((int)uVar11 == -1) {
            return 0;
          }
          RVar13 = ref_cell->ref_adj->item[(int)uVar11].ref;
          while( true ) {
            uVar7 = ref_cell_nodes(ref_cell,RVar13,(REF_INT *)&local_a8);
            iVar12 = iStack_9c;
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x39d,"ref_geom_eval_edge_face_uv",(ulong)uVar7,"cell nodes");
              return uVar7;
            }
            uVar7 = ref_geom_cell_tuv(local_c8,iVar1,(REF_INT *)&local_a8,2,&local_b8,&local_d4);
            if (uVar7 != 0) break;
            if (local_d4 == 1) {
              uVar9 = 0xffffffff;
              if ((-1 < iVar1) && (uVar9 = 0xffffffff, iVar1 < local_c0->nnode)) {
                uVar9 = (ulong)(uint)local_c0->first[lVar15];
              }
              if ((int)uVar9 != -1) {
                iVar10 = local_c0->item[(int)uVar9].ref;
                pRVar3 = local_c8->descr;
                pRVar4 = local_c0->item;
                do {
                  if ((pRVar3[iVar10 * 6] == 2) && (iVar12 == pRVar3[(int)(iVar10 * 6 | 1)])) {
                    pRVar5 = local_c8->param;
                    pRVar5[iVar10 * 2] = local_b8;
                    pRVar5[iVar10 * 2 + 1] = local_b0;
                  }
                  iVar2 = pRVar4[(int)uVar9].next;
                  uVar9 = (ulong)iVar2;
                  if (uVar9 == 0xffffffffffffffff) {
                    iVar10 = -1;
                  }
                  else {
                    iVar10 = pRVar4[uVar9].ref;
                  }
                } while (iVar2 != -1);
              }
            }
            pRVar4 = ref_cell->ref_adj->item;
            iVar12 = pRVar4[(int)uVar11].next;
            uVar11 = (ulong)iVar12;
            if (uVar11 == 0xffffffffffffffff) {
              RVar13 = -1;
            }
            else {
              RVar13 = pRVar4[uVar11].ref;
            }
            if (iVar12 == -1) {
              return 0;
            }
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3a0,"ref_geom_eval_edge_face_uv",(ulong)uVar7,"cell uv");
          return uVar7;
        }
      }
      uVar11 = 0xffffffff;
      if ((-1 < iVar1) && (uVar11 = 0xffffffff, iVar1 < pRVar14->nnode)) {
        uVar11 = (ulong)(uint)pRVar14->first[lVar15];
      }
      if ((int)uVar11 != -1) {
        RVar13 = pRVar14->item[(int)uVar11].ref;
        do {
          pRVar3 = ref_geom->descr;
          if (pRVar3[RVar13 * 6] == 2) {
            uVar8 = ref_egads_edge_face_uv
                              (ref_geom,pRVar3[uVar7 | 1],pRVar3[(int)(RVar13 * 6 | 1)],0,local_d0,
                               &local_a8);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x3b2,"ref_geom_eval_edge_face_uv",(ulong)uVar8,"edge uv");
              return uVar8;
            }
            pRVar5 = local_c8->param;
            pRVar5[RVar13 * 2] = local_a8;
            pRVar5[RVar13 * 2 + 1] = (REF_DBL)CONCAT44(iStack_9c,local_a0);
            ref_geom = local_c8;
            pRVar14 = local_c0;
          }
          iVar1 = pRVar14->item[(int)uVar11].next;
          uVar11 = (ulong)iVar1;
          if (uVar11 == 0xffffffffffffffff) {
            RVar13 = -1;
          }
          else {
            RVar13 = pRVar14->item[uVar11].ref;
          }
        } while (iVar1 != -1);
      }
      RVar16 = 0;
    }
  }
  return RVar16;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,
                                                     REF_INT edge_geom) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT node, cell_item, geom_item, cell, face_geom;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  double t;
  double uv[2], edgeuv[2];
  int sense;
  REF_INT faceid;
  REF_BOOL have_jump;

  if (edge_geom < 0 || ref_geom_max(ref_geom) <= edge_geom) return REF_INVALID;
  if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) return REF_INVALID;

  t = ref_geom_param(ref_geom, 0, edge_geom);
  node = ref_geom_node(ref_geom, edge_geom);

  have_jump = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
      have_jump = have_jump || (0 != ref_geom_jump(ref_geom, face_geom));
    }
  }

  if (have_jump) {
    /* uv update at jump not needed, should always depend on cell_c2n */
    /* keeping for consistency with non-jump */
    each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      faceid = nodes[3];
      RSS(ref_geom_cell_tuv(ref_geom, node, nodes, REF_GEOM_FACE, uv, &sense),
          "cell uv");
      if (1 == sense) { /* sense to use is arbitrary */
        each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom) &&
              faceid == ref_geom_id(ref_geom, face_geom)) {
            ref_geom_param(ref_geom, 0, face_geom) = uv[0];
            ref_geom_param(ref_geom, 1, face_geom) = uv[1];
          }
        }
      }
    }
  } else {
    each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        faceid = ref_geom_id(ref_geom, face_geom);
        sense = 0;
        RSS(ref_egads_edge_face_uv(ref_geom, ref_geom_id(ref_geom, edge_geom),
                                   faceid, sense, t, edgeuv),
            "edge uv");
        ref_geom_param(ref_geom, 0, face_geom) = edgeuv[0];
        ref_geom_param(ref_geom, 1, face_geom) = edgeuv[1];
      }
    }
  }

  return REF_SUCCESS;
}